

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::AssertionHandler::complete(AssertionHandler *this)

{
  undefined8 uVar1;
  AssertionHandler *in_RDI;
  
  setCompleted(in_RDI);
  if (((in_RDI->m_reaction).shouldDebugBreak & 1U) != 0) {
    complete::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)0x11917b);
  }
  if (((in_RDI->m_reaction).shouldThrow & 1U) != 0) {
    uVar1 = __cxa_allocate_exception(1);
    __cxa_throw(uVar1,&TestFailureException::typeinfo,0);
  }
  return;
}

Assistant:

void AssertionHandler::complete() {
        setCompleted();
        if( m_reaction.shouldDebugBreak ) {

            // If you find your debugger stopping you here then go one level up on the
            // call-stack for the code that caused it (typically a failed assertion)

            // (To go back to the test and change execution, jump over the throw, next)
            CATCH_BREAK_INTO_DEBUGGER();
        }
        if (m_reaction.shouldThrow) {
#if !defined(CATCH_CONFIG_DISABLE_EXCEPTIONS)
            throw Catch::TestFailureException();
#else
            CATCH_ERROR( "Test failure requires aborting test!" );
#endif
        }
    }